

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mask.c
# Opt level: O2

int mask_intersect(uint32_t *a,uint32_t *b,int size)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int j;
  uint uVar4;
  
  uVar1 = (long)(size + 0x1f) / 0x20;
  uVar3 = 0;
  uVar2 = uVar1 & 0xffffffff;
  if ((int)uVar1 < 1) {
    uVar2 = uVar3;
  }
  do {
    if (uVar3 == uVar2) {
      return -1;
    }
    if ((b[uVar3] & a[uVar3]) != 0) {
      for (uVar4 = 0; uVar4 != 0x20; uVar4 = uVar4 + 1) {
        if (((b[uVar3] & a[uVar3]) >> (uVar4 & 0x1f) & 1) != 0) {
          return uVar4;
        }
      }
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

int mask_intersect(uint32_t *a, uint32_t *b, int size) {
	int rsize = MASK_SIZE(size);
	int i;
	for (i = 0; i < rsize; i++)
		if (a[i] & b[i]) {
			int j;
			for (j = 0; j < MASK_CHUNK_SIZE; j++)
				if (a[i] & b[i] & (uint32_t)1 << j)
					return j;
		}
	return -1;
}